

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_compressStream_generic
                 (ZSTD_CStream *zcs,ZSTD_outBuffer *output,ZSTD_inBuffer *input,
                 ZSTD_EndDirective flushMode)

{
  ZSTD_cStreamStage ZVar1;
  void *pvVar2;
  void *pvVar3;
  size_t sVar4;
  ulong uVar5;
  size_t sVar6;
  char *dst;
  uint uVar7;
  void *pvVar8;
  ulong uVar9;
  size_t sVar10;
  void *__src;
  char *dst_00;
  ulong uVar11;
  void *local_70;
  
  pvVar2 = input->src;
  pvVar8 = (void *)(input->size + (long)pvVar2);
  pvVar3 = output->dst;
  sVar10 = output->size;
  dst = (char *)(output->pos + (long)pvVar3);
  __src = (void *)(input->pos + (long)pvVar2);
LAB_004cf099:
  do {
    ZVar1 = zcs->streamStage;
    do {
      if (ZVar1 == zcss_init) {
        return 0xffffffffffffffc2;
      }
      if (ZVar1 == zcss_load) {
        if (flushMode == ZSTD_e_end) {
          sVar4 = (long)pvVar3 + (sVar10 - (long)dst);
          uVar5 = (long)pvVar8 - (long)__src;
          uVar9 = (ulong)(0x20000U - (int)uVar5 >> 0xb);
          if (0x1ffff < uVar5) {
            uVar9 = 0;
          }
          sVar6 = zcs->inBuffPos;
          if (sVar6 == 0 && uVar9 + (uVar5 >> 8) + uVar5 <= sVar4) {
            sVar10 = ZSTD_compressEnd(zcs,dst,sVar4,__src,uVar5);
            if (0xffffffffffffff88 < sVar10) {
              return sVar10;
            }
            dst = dst + sVar10;
            zcs->frameEnded = 1;
            local_70 = pvVar8;
            goto LAB_004cf364;
          }
        }
        else {
          sVar6 = zcs->inBuffPos;
          uVar5 = (long)pvVar8 - (long)__src;
        }
        uVar9 = zcs->inBuffTarget - sVar6;
        if (uVar5 <= uVar9) {
          uVar9 = uVar5;
        }
        if (uVar9 != 0) {
          memcpy(zcs->inBuff + sVar6,__src,uVar9);
          sVar6 = zcs->inBuffPos;
        }
        uVar5 = sVar6 + uVar9;
        zcs->inBuffPos = uVar5;
        __src = (void *)((long)__src + uVar9);
        local_70 = __src;
        if (flushMode == ZSTD_e_flush) {
          if (uVar5 == zcs->inToCompress) goto LAB_004cf37c;
        }
        else if ((flushMode == ZSTD_e_continue) && (uVar5 < zcs->inBuffTarget)) goto LAB_004cf37c;
        sVar6 = uVar5 - zcs->inToCompress;
        uVar5 = (long)pvVar3 + (sVar10 - (long)dst);
        uVar9 = (ulong)(0x20000U - (int)sVar6 >> 0xb);
        if (0x1ffff < sVar6) {
          uVar9 = 0;
        }
        sVar4 = uVar5;
        dst_00 = dst;
        if (uVar5 < uVar9 + (sVar6 >> 8) + sVar6) {
          dst_00 = zcs->outBuff;
          sVar4 = zcs->outBuffSize;
        }
        if (flushMode == ZSTD_e_end && __src == pvVar8) {
          uVar9 = ZSTD_compressEnd(zcs,dst_00,sVar4,zcs->inBuff + zcs->inToCompress,sVar6);
        }
        else {
          uVar9 = ZSTD_compressContinue_internal
                            (zcs,dst_00,sVar4,zcs->inBuff + zcs->inToCompress,sVar6,1,0);
        }
        if (0xffffffffffffff88 < uVar9) {
          return uVar9;
        }
        uVar7 = (uint)(flushMode == ZSTD_e_end && __src == pvVar8);
        zcs->frameEnded = uVar7;
        sVar6 = zcs->inBuffPos;
        uVar11 = zcs->blockSize + sVar6;
        zcs->inBuffTarget = uVar11;
        if (zcs->inBuffSize < uVar11) {
          zcs->inBuffPos = 0;
          zcs->inBuffTarget = zcs->blockSize;
          sVar6 = 0;
        }
        zcs->inToCompress = sVar6;
        if (dst_00 != dst) {
          zcs->outBuffContentSize = uVar9;
          zcs->outBuffFlushedSize = 0;
          zcs->streamStage = zcss_flush;
          sVar6 = 0;
          goto LAB_004cf2bc;
        }
        dst = dst + uVar9;
        local_70 = pvVar8;
        if (uVar7 == 0) goto LAB_004cf099;
        goto LAB_004cf364;
      }
    } while (ZVar1 != zcss_flush);
    uVar9 = zcs->outBuffContentSize;
    sVar6 = zcs->outBuffFlushedSize;
    uVar5 = (long)pvVar3 + (sVar10 - (long)dst);
    local_70 = __src;
LAB_004cf2bc:
    uVar9 = uVar9 - sVar6;
    uVar11 = uVar9;
    if (uVar5 < uVar9) {
      uVar11 = uVar5;
    }
    if (uVar11 != 0) {
      memcpy(dst,zcs->outBuff + sVar6,uVar11);
      sVar6 = zcs->outBuffFlushedSize;
    }
    dst = dst + uVar11;
    zcs->outBuffFlushedSize = sVar6 + uVar11;
    if (uVar5 < uVar9) goto LAB_004cf37c;
    zcs->outBuffContentSize = 0;
    zcs->outBuffFlushedSize = 0;
    if (zcs->frameEnded != 0) {
LAB_004cf364:
      zcs->streamStage = zcss_init;
      zcs->pledgedSrcSizePlusOne = 0;
LAB_004cf37c:
      input->pos = (long)local_70 - (long)pvVar2;
      output->pos = (long)dst - (long)pvVar3;
      if (zcs->frameEnded == 0) {
        sVar10 = zcs->inBuffTarget - zcs->inBuffPos;
        if (sVar10 == 0) {
          sVar10 = zcs->blockSize;
        }
      }
      else {
        sVar10 = 0;
      }
      return sVar10;
    }
    zcs->streamStage = zcss_load;
    __src = local_70;
  } while( true );
}

Assistant:

size_t ZSTD_compressStream_generic(ZSTD_CStream* zcs,
                                   ZSTD_outBuffer* output,
                                   ZSTD_inBuffer* input,
                                   ZSTD_EndDirective const flushMode)
{
    const char* const istart = (const char*)input->src;
    const char* const iend = istart + input->size;
    const char* ip = istart + input->pos;
    char* const ostart = (char*)output->dst;
    char* const oend = ostart + output->size;
    char* op = ostart + output->pos;
    U32 someMoreWork = 1;

    /* check expectations */
    DEBUGLOG(5, "ZSTD_compressStream_generic, flush=%u", (unsigned)flushMode);
    assert(zcs->inBuff != NULL);
    assert(zcs->inBuffSize > 0);
    assert(zcs->outBuff !=  NULL);
    assert(zcs->outBuffSize > 0);
    assert(output->pos <= output->size);
    assert(input->pos <= input->size);

    while (someMoreWork) {
        switch(zcs->streamStage)
        {
        case zcss_init:
            /* call ZSTD_initCStream() first ! */
            return ERROR(init_missing);

        case zcss_load:
            if ( (flushMode == ZSTD_e_end)
              && ((size_t)(oend-op) >= ZSTD_compressBound(iend-ip))  /* enough dstCapacity */
              && (zcs->inBuffPos == 0) ) {
                /* shortcut to compression pass directly into output buffer */
                size_t const cSize = ZSTD_compressEnd(zcs,
                                                op, oend-op, ip, iend-ip);
                DEBUGLOG(4, "ZSTD_compressEnd : cSize=%u", (unsigned)cSize);
                if (ZSTD_isError(cSize)) return cSize;
                ip = iend;
                op += cSize;
                zcs->frameEnded = 1;
                ZSTD_CCtx_reset(zcs, ZSTD_reset_session_only);
                someMoreWork = 0; break;
            }
            /* complete loading into inBuffer */
            {   size_t const toLoad = zcs->inBuffTarget - zcs->inBuffPos;
                size_t const loaded = ZSTD_limitCopy(
                                        zcs->inBuff + zcs->inBuffPos, toLoad,
                                        ip, iend-ip);
                zcs->inBuffPos += loaded;
                ip += loaded;
                if ( (flushMode == ZSTD_e_continue)
                  && (zcs->inBuffPos < zcs->inBuffTarget) ) {
                    /* not enough input to fill full block : stop here */
                    someMoreWork = 0; break;
                }
                if ( (flushMode == ZSTD_e_flush)
                  && (zcs->inBuffPos == zcs->inToCompress) ) {
                    /* empty */
                    someMoreWork = 0; break;
                }
            }
            /* compress current block (note : this stage cannot be stopped in the middle) */
            DEBUGLOG(5, "stream compression stage (flushMode==%u)", flushMode);
            {   void* cDst;
                size_t cSize;
                size_t const iSize = zcs->inBuffPos - zcs->inToCompress;
                size_t oSize = oend-op;
                unsigned const lastBlock = (flushMode == ZSTD_e_end) && (ip==iend);
                if (oSize >= ZSTD_compressBound(iSize))
                    cDst = op;   /* compress into output buffer, to skip flush stage */
                else
                    cDst = zcs->outBuff, oSize = zcs->outBuffSize;
                cSize = lastBlock ?
                        ZSTD_compressEnd(zcs, cDst, oSize,
                                    zcs->inBuff + zcs->inToCompress, iSize) :
                        ZSTD_compressContinue(zcs, cDst, oSize,
                                    zcs->inBuff + zcs->inToCompress, iSize);
                if (ZSTD_isError(cSize)) return cSize;
                zcs->frameEnded = lastBlock;
                /* prepare next block */
                zcs->inBuffTarget = zcs->inBuffPos + zcs->blockSize;
                if (zcs->inBuffTarget > zcs->inBuffSize)
                    zcs->inBuffPos = 0, zcs->inBuffTarget = zcs->blockSize;
                DEBUGLOG(5, "inBuffTarget:%u / inBuffSize:%u",
                         (unsigned)zcs->inBuffTarget, (unsigned)zcs->inBuffSize);
                if (!lastBlock)
                    assert(zcs->inBuffTarget <= zcs->inBuffSize);
                zcs->inToCompress = zcs->inBuffPos;
                if (cDst == op) {  /* no need to flush */
                    op += cSize;
                    if (zcs->frameEnded) {
                        DEBUGLOG(5, "Frame completed directly in outBuffer");
                        someMoreWork = 0;
                        ZSTD_CCtx_reset(zcs, ZSTD_reset_session_only);
                    }
                    break;
                }
                zcs->outBuffContentSize = cSize;
                zcs->outBuffFlushedSize = 0;
                zcs->streamStage = zcss_flush; /* pass-through to flush stage */
            }
	    /* fall-through */
        case zcss_flush:
            DEBUGLOG(5, "flush stage");
            {   size_t const toFlush = zcs->outBuffContentSize - zcs->outBuffFlushedSize;
                size_t const flushed = ZSTD_limitCopy(op, oend-op,
                            zcs->outBuff + zcs->outBuffFlushedSize, toFlush);
                DEBUGLOG(5, "toFlush: %u into %u ==> flushed: %u",
                            (unsigned)toFlush, (unsigned)(oend-op), (unsigned)flushed);
                op += flushed;
                zcs->outBuffFlushedSize += flushed;
                if (toFlush!=flushed) {
                    /* flush not fully completed, presumably because dst is too small */
                    assert(op==oend);
                    someMoreWork = 0;
                    break;
                }
                zcs->outBuffContentSize = zcs->outBuffFlushedSize = 0;
                if (zcs->frameEnded) {
                    DEBUGLOG(5, "Frame completed on flush");
                    someMoreWork = 0;
                    ZSTD_CCtx_reset(zcs, ZSTD_reset_session_only);
                    break;
                }
                zcs->streamStage = zcss_load;
                break;
            }

        default: /* impossible */
            assert(0);
        }
    }

    input->pos = ip - istart;
    output->pos = op - ostart;
    if (zcs->frameEnded) return 0;
    return ZSTD_nextInputSizeHint(zcs);
}